

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int cm_expat_XML_SetParamEntityParsing(XML_Parser parser,XML_ParamEntityParsing parsing)

{
  *(XML_ParamEntityParsing *)((long)parser + 0x48c) = parsing;
  return 1;
}

Assistant:

int XML_SetParamEntityParsing(XML_Parser parser,
                              enum XML_ParamEntityParsing parsing)
{
#ifdef XML_DTD
  paramEntityParsing = parsing;
  return 1;
#else
  return parsing == XML_PARAM_ENTITY_PARSING_NEVER;
#endif
}